

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O1

int priv_encode_gost(PKCS8_PRIV_KEY_INFO *p8,EVP_PKEY *pk)

{
  uchar uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ASN1_OBJECT *aobj;
  char *__s1;
  uchar *buf;
  BIGNUM *bn;
  ASN1_STRING *a;
  ASN1_STRING *str;
  long lVar5;
  uchar *puVar6;
  undefined8 uVar7;
  uint len;
  uchar *priv_buf;
  uchar *local_38;
  
  iVar3 = EVP_PKEY_get_base_id(pk);
  aobj = OBJ_nid2obj(iVar3);
  uVar4 = pkey_bits_gost(pk);
  __s1 = get_gost_engine_param(2);
  if (7 < (int)uVar4) {
    len = uVar4 >> 3;
    buf = (uchar *)CRYPTO_secure_malloc
                             ((ulong)len,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                              ,0x2a8);
    if (buf != (uchar *)0x0) {
      bn = gost_get0_priv_key(pk);
      iVar3 = store_bignum(bn,buf,len);
      if (iVar3 == 0) {
        uVar7 = 0x2ad;
      }
      else {
        a = encode_gost_algor_params(pk);
        if (a == (ASN1_STRING *)0x0) {
          uVar7 = 0x2b3;
        }
        else {
          if (0xf < uVar4) {
            lVar2 = (ulong)len - 1;
            lVar5 = 0;
            puVar6 = buf;
            do {
              uVar1 = *puVar6;
              *puVar6 = buf[lVar5 + lVar2];
              buf[lVar5 + lVar2] = uVar1;
              puVar6 = puVar6 + 1;
              lVar5 = lVar5 + -1;
            } while (-lVar5 != (ulong)(uVar4 >> 4));
          }
          if ((__s1 == (char *)0x0) || (iVar3 = strcmp(__s1,"LEGACY_PK_WRAP"), iVar3 != 0)) {
            iVar3 = PKCS8_pkey_set0((PKCS8_PRIV_KEY_INFO *)p8,aobj,0,0x10,a,buf,len);
            return iVar3;
          }
          str = ASN1_STRING_new();
          local_38 = (uchar *)0x0;
          if ((str != (ASN1_STRING *)0x0) &&
             (iVar3 = ASN1_OCTET_STRING_set(str,buf,len), iVar3 != 0)) {
            iVar3 = i2d_ASN1_OCTET_STRING(str,&local_38);
            ASN1_STRING_free(str);
            CRYPTO_secure_free(buf,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                               ,0x2ca);
            iVar3 = PKCS8_pkey_set0((PKCS8_PRIV_KEY_INFO *)p8,aobj,0,0x10,a,local_38,iVar3);
            return iVar3;
          }
          ASN1_STRING_free(str);
          ASN1_STRING_free((ASN1_STRING *)a);
          uVar7 = 0x2c5;
        }
      }
      CRYPTO_secure_free(buf,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                         ,uVar7);
    }
  }
  return 0;
}

Assistant:

static int priv_encode_gost(PKCS8_PRIV_KEY_INFO *p8, const EVP_PKEY *pk)
{
    ASN1_OBJECT *algobj = OBJ_nid2obj(EVP_PKEY_base_id(pk));
    ASN1_STRING *params = NULL;
    unsigned char *buf = NULL;
    int key_len = pkey_bits_gost(pk), i = 0;
    /* unmasked private key */
    const char *pk_format = get_gost_engine_param(GOST_PARAM_PK_FORMAT);

    key_len = (key_len < 0) ? 0 : key_len / 8;
    if (key_len == 0 || !(buf = OPENSSL_secure_malloc(key_len))) {
        return 0;
    }

    if (!store_bignum(gost_get0_priv_key(pk), buf, key_len)) {
        OPENSSL_secure_free(buf);
        return 0;
    }

    params = encode_gost_algor_params(pk);
    if (!params) {
        OPENSSL_secure_free(buf);
        return 0;
    }

    /* Convert buf to Little-endian */
    for (i = 0; i < key_len / 2; i++) {
        unsigned char tmp = buf[i];
        buf[i] = buf[key_len - 1 - i];
        buf[key_len - 1 - i] = tmp;
    }

    if (pk_format != NULL && strcmp(pk_format, PK_WRAP_PARAM) == 0) {
        ASN1_STRING *octet = ASN1_STRING_new();
        int priv_len = 0;
        unsigned char *priv_buf = NULL;
        if (!octet || !ASN1_OCTET_STRING_set(octet, buf, key_len)) {
            ASN1_STRING_free(octet);
            ASN1_STRING_free(params);
            OPENSSL_secure_free(buf);
            return 0;
        }
        priv_len = i2d_ASN1_OCTET_STRING(octet, &priv_buf);
        ASN1_STRING_free(octet);
        OPENSSL_secure_free(buf);

        return PKCS8_pkey_set0(p8, algobj, 0, V_ASN1_SEQUENCE, params,
                               priv_buf, priv_len);
    }

    return PKCS8_pkey_set0(p8, algobj, 0, V_ASN1_SEQUENCE, params,
                           buf, key_len);
}